

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<int>::set_size(RepeatedField<int> *this,bool is_soo,int size)

{
  int v1;
  int iVar1;
  LogMessage *pLVar2;
  undefined1 auVar3 [16];
  LogMessageFatal local_38 [23];
  Voidify local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  int size_local;
  bool is_soo_local;
  RepeatedField<int> *this_local;
  
  absl_log_internal_check_op_result._0_4_ = size;
  absl_log_internal_check_op_result._7_1_ = is_soo;
  _size_local = this;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue(size);
  iVar1 = Capacity(this,(bool)(absl_log_internal_check_op_result._7_1_ & 1));
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar1);
  local_20 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (v1,iVar1,"size <= Capacity(is_soo)");
  if (local_20 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x1e9,auVar3._0_8_,auVar3._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  internal::SooRep::set_size
            (&this->soo_rep_,(bool)(absl_log_internal_check_op_result._7_1_ & 1),
             (int)absl_log_internal_check_op_result);
  return;
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_LE(size, Capacity(is_soo));
    soo_rep_.set_size(is_soo, size);
  }